

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase_Coding_Sine_Lowpass_Results.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  time_t tVar2;
  Clock *this;
  ANN *this_00;
  Parameters *param;
  Population *this_01;
  ArtificialPopulation *this_02;
  Population *this_03;
  Population *this_04;
  Population *this_05;
  TemporalPhaseEncodingSynapse_param *pTVar3;
  TemporalPhaseEncodingSynapse *this_06;
  TemporalPhaseDecodingSynapse_param *pTVar4;
  TemporalPhaseDecodingSynapse *this_07;
  TemporalPhaseEncodingSynapse *this_08;
  TemporalPhaseDecodingSynapse *this_09;
  Network_param *param_00;
  ostream *poVar5;
  int iVar6;
  string filterType;
  Network n;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  long *local_138;
  char *local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Network local_78;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"lowpass","");
  if (argc == 0xc) {
    local_188 = atof(argv[1]);
    local_170 = atof(argv[2]);
    local_180 = atof(argv[3]);
    local_140 = atof(argv[4]);
    local_148 = atof(argv[5]);
    local_158 = atof(argv[6]);
    local_150 = atof(argv[7]);
    local_178 = atof(argv[8]);
    local_160 = atof(argv[9]);
    local_168 = atof(argv[10]);
    pcVar1 = local_130;
    __s = argv[0xb];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_138,0,pcVar1,(ulong)__s);
  }
  else {
    local_188 = 1.0;
    local_150 = 0.0;
    local_178 = 20.0;
    local_160 = 800000.0;
    local_168 = 0.0001;
    local_158 = 0.0;
    local_148 = 0.0;
    local_140 = 0.0;
    local_180 = 0.0;
    local_170 = 0.0;
  }
  this = Clock::getInstance();
  Clock::setDt(this,local_168);
  this_00 = (ANN *)operator_new(0x40);
  ANN::ANN(this_00);
  ANN::setInputSize(this_00,1);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_138,local_130 + (long)local_138);
  ANN::addLayer(this_00,1,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  param = (Parameters *)operator_new(0x58);
  *(undefined8 *)(param + 0x10) = 0;
  *(undefined8 *)(param + 0x18) = 0;
  *(undefined8 *)param = 0;
  *(undefined8 *)(param + 8) = 0;
  *(undefined8 *)(param + 0x20) = 0;
  *(undefined8 *)(param + 0x28) = 0;
  *(undefined8 *)(param + 0x30) = 0;
  *(undefined8 *)(param + 0x38) = 0;
  *(undefined8 *)(param + 0x40) = 0;
  *(undefined8 *)(param + 0x48) = 0;
  *(undefined8 *)(param + 0x50) = 0;
  *(undefined8 *)(param + 8) = 0;
  *(undefined8 *)(param + 0x10) = 0;
  *(undefined8 *)(param + 0x18) = 0;
  *(undefined8 *)(param + 0x20) = 0;
  *(undefined8 *)(param + 0x28) = 0;
  *(undefined8 *)(param + 0x30) = 0;
  *(undefined8 *)(param + 0x38) = 0x3ff0000000000000;
  *(double *)param = local_188;
  *(double *)(param + 8) = local_170;
  *(double *)(param + 0x10) = local_180;
  *(double *)(param + 0x18) = local_140;
  *(double *)(param + 0x20) = local_148;
  *(double *)(param + 0x28) = local_158;
  *(double *)(param + 0x30) = local_150;
  *(undefined8 *)(param + 0x38) = 0x3fb0000000000000;
  *(undefined8 *)(param + 0x40) = 0x3fe0000000000000;
  this_01 = (Population *)operator_new(0x60);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SignalGenerator","");
  Population::Population(this_01,1,&local_b8,param);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this_02 = (ArtificialPopulation *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this_02,this_00);
  this_03 = (Population *)operator_new(0x60);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"PassThrough","");
  Population::Population(this_03,1,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  this_04 = (Population *)operator_new(0x60);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"PassThrough","");
  Population::Population(this_04,1,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  this_05 = (Population *)operator_new(0x60);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"PassThrough","");
  Population::Population(this_05,1,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
  *(undefined8 *)pTVar3 = 0;
  pTVar3->som_phase = 0.0;
  pTVar3->som_phase = 0.0;
  pTVar3->window_length_s = local_178;
  iVar6 = (int)local_160;
  pTVar3->som_frequency = iVar6;
  this_06 = (TemporalPhaseEncodingSynapse *)operator_new(0x78);
  TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse(this_06,this_01,this_03,pTVar3);
  pTVar4 = (TemporalPhaseDecodingSynapse_param *)operator_new(0x20);
  *(undefined8 *)pTVar4 = 0;
  pTVar4->som_phase = 0.0;
  pTVar4->window_length_s = 0.0;
  pTVar4->delay_s = 0.0;
  pTVar4->som_phase = 0.0;
  pTVar4->delay_s = 0.0;
  pTVar4->som_frequency = iVar6;
  *(undefined4 *)&pTVar4->som_phase = 0;
  *(undefined4 *)((long)&pTVar4->som_phase + 4) = 0;
  *(undefined4 *)&pTVar4->window_length_s = 0;
  *(undefined4 *)((long)&pTVar4->window_length_s + 4) = 0x3fe00000;
  pTVar4->window_length_s = local_178;
  this_07 = (TemporalPhaseDecodingSynapse *)operator_new(0x78);
  TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse
            (this_07,this_03,(Population *)this_02,pTVar4);
  pTVar3 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
  *(undefined8 *)pTVar3 = 0;
  pTVar3->som_phase = 0.0;
  pTVar3->som_phase = 0.0;
  pTVar3->window_length_s = local_178;
  pTVar3->som_frequency = iVar6;
  this_08 = (TemporalPhaseEncodingSynapse *)operator_new(0x78);
  TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse
            (this_08,(Population *)this_02,this_04,pTVar3);
  pTVar4 = (TemporalPhaseDecodingSynapse_param *)operator_new(0x20);
  *(undefined8 *)pTVar4 = 0;
  pTVar4->som_phase = 0.0;
  pTVar4->window_length_s = 0.0;
  pTVar4->delay_s = 0.0;
  pTVar4->som_phase = 0.0;
  pTVar4->delay_s = 0.0;
  pTVar4->som_frequency = iVar6;
  *(undefined4 *)&pTVar4->som_phase = 0;
  *(undefined4 *)((long)&pTVar4->som_phase + 4) = 0;
  *(undefined4 *)&pTVar4->window_length_s = 0;
  *(undefined4 *)((long)&pTVar4->window_length_s + 4) = 0x3fe00000;
  pTVar4->window_length_s = local_178;
  this_09 = (TemporalPhaseDecodingSynapse *)operator_new(0x78);
  TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse(this_09,this_04,this_05,pTVar4);
  param_00 = (Network_param *)operator_new(8);
  param_00->dt = local_168;
  Network::Network(&local_78,param_00);
  Network::add(&local_78,(Synapse *)this_06);
  Network::add(&local_78,(Synapse *)this_07);
  Network::add(&local_78,(Synapse *)this_08);
  Network::add(&local_78,(Synapse *)this_09);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  Network::run(&local_78,1.0);
  Network::~Network(&local_78);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double window_length = 20;
    double som_frequency = 800000;
    double dt = 0.0001;
    string filterType = "lowpass";
    if(argc == 12) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        window_length = atof(argv[8]);
        som_frequency = atof(argv[9]);
        dt = atof(argv[10]);
        filterType = argv[11];
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, filterType);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/16.0;
    paramp1->offset = 0.5;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "PassThrough");
    Population* p4 = new Population(1, "PassThrough");
    Population* p5 = new Population(1, "PassThrough");

    // Synapses
    TemporalPhaseEncodingSynapse_param* params1 = new TemporalPhaseEncodingSynapse_param();
    params1->window_length_s = window_length;
    params1->som_frequency = som_frequency;
    params1->som_phase = 0;
    TemporalPhaseEncodingSynapse* s1 = new TemporalPhaseEncodingSynapse(p1, p3, params1);

    TemporalPhaseDecodingSynapse_param* params2 = new TemporalPhaseDecodingSynapse_param();
    params2->window_length_s = window_length;
    params2->som_frequency = som_frequency;
    params2->som_phase = 0;
    TemporalPhaseDecodingSynapse* s2 = new TemporalPhaseDecodingSynapse(p3, p2, params2);

    // Synapses
    TemporalPhaseEncodingSynapse_param* params3 = new TemporalPhaseEncodingSynapse_param();
    params3->window_length_s = window_length;
    params3->som_frequency = som_frequency;
    params3->som_phase = 0;
    TemporalPhaseEncodingSynapse* s3 = new TemporalPhaseEncodingSynapse(p2, p4, params3);

    TemporalPhaseDecodingSynapse_param* params4 = new TemporalPhaseDecodingSynapse_param();
    params4->window_length_s = window_length;
    params4->som_frequency = som_frequency;
    params4->som_phase = 0;
    TemporalPhaseDecodingSynapse* s4 = new TemporalPhaseDecodingSynapse(p4, p5, params4);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);
    n.add(s3);
    n.add(s4);

    cout << (long)s2 << endl;
    cout << (long)s4 << endl;
    cout << (long)p3 << endl;

    // Run the network for 1 second
    n.run(1.0);
    
    return 0;
}